

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

char ** cargo_split_commandline(cargo_splitcmd_flags_t flags,char *cmdline,int *argc)

{
  int iVar1;
  char **__ptr;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  wordexp_t p;
  wordexp_t local_38;
  
  if (argc == (int *)0x0) {
    __assert_fail("argc",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x1ae1,
                  "char **cargo_split_commandline(cargo_splitcmd_flags_t, const char *, int *)");
  }
  if (cmdline != (char *)0x0) {
    local_38.we_wordc = 0;
    local_38.we_wordv = (char **)0x0;
    local_38.we_offs = 0;
    iVar1 = wordexp(cmdline,&local_38,0);
    if (iVar1 != 0) {
      return (char **)0x0;
    }
    *argc = (int)local_38.we_wordc;
    __ptr = (char **)_cargo_calloc((long)(int)local_38.we_wordc,8);
    if (__ptr != (char **)0x0) {
      if (local_38.we_wordc != 0) {
        uVar3 = 0;
        do {
          pcVar2 = _cargo_strdup(local_38.we_wordv[uVar3]);
          __ptr[uVar3] = pcVar2;
          if (pcVar2 == (char *)0x0) {
            local_38.we_offs = 0;
            wordfree(&local_38);
            iVar1 = *argc;
            if (0 < iVar1) {
              lVar4 = 0;
              do {
                pcVar2 = __ptr[lVar4];
                if (pcVar2 != (char *)0x0) {
                  if (replaced_cargo_free == (cargo_free_f)0x0) {
                    free(pcVar2);
                  }
                  else {
                    (*replaced_cargo_free)(pcVar2);
                  }
                  __ptr[lVar4] = (char *)0x0;
                  iVar1 = *argc;
                }
                lVar4 = lVar4 + 1;
              } while (lVar4 < iVar1);
            }
            if (replaced_cargo_free != (cargo_free_f)0x0) {
              (*replaced_cargo_free)(__ptr);
              return (char **)0x0;
            }
            free(__ptr);
            return (char **)0x0;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < local_38.we_wordc);
      }
      local_38.we_offs = 0;
      wordfree(&local_38);
      return __ptr;
    }
    local_38.we_offs = 0;
    wordfree(&local_38);
  }
  return (char **)0x0;
}

Assistant:

char **cargo_split_commandline(cargo_splitcmd_flags_t flags, const char *cmdline, int *argc)
{
    int i;
    char **argv = NULL;
    assert(argc);

    if (!cmdline)
    {
        CARGODBG(1, "Got NULL input\n");
        return NULL;
    }

    // Posix.
    #ifndef _WIN32
    {
        int ret;
        wordexp_t p;
        memset(&p, 0, sizeof(p));

        // Note! This expands shell variables.
        if ((ret = wordexp(cmdline, &p, 0)))
        {
            CARGODBG(1, "wordexp error %d: '%s'\n", ret, cmdline);
            return NULL;
        }

        *argc = p.we_wordc;

        if (!(argv = _cargo_calloc(*argc, sizeof(char *))))
        {
            CARGODBG(1, "Out of memory!\n");
            goto fail;
        }

        for (i = 0; i < p.we_wordc; i++)
        {
            if (!(argv[i] = _cargo_strdup(p.we_wordv[i])))
            {
                CARGODBG(1, "Out of memory!\n");
                goto fail;
            }
        }

        // wordfree seems to fail to free everything in the wordexp_t struct
        // at least on OSX 10.9.5. This is supposed to help on 10.8.5 at least.
        p.we_offs = 0;
        wordfree(&p);

        return argv;
    fail:
        p.we_offs = 0;
        wordfree(&p);
    }
    #else // WIN32
    {
        // TODO: __getmainargs is an alternative... https://msdn.microsoft.com/en-us/library/ff770599.aspx
        wchar_t **wargs = NULL;
        size_t needed = 0;
        wchar_t *cmdlinew = NULL;
        size_t len = strlen(cmdline) + 1;

        if (!(cmdlinew = _cargo_calloc(len, sizeof(wchar_t))))
        {
            CARGODBG(1, "Out of memory!\n");
            goto fail;
        }

        if (!MultiByteToWideChar(CP_ACP, 0, cmdline, -1, cmdlinew, len))
        {
            CARGODBG(1, "Failed to convert to unicode!\n");
            goto fail;
        }

        if (!(wargs = CommandLineToArgvW(cmdlinew, argc)))
        {
            CARGODBG(1, "Out of memory!\n");
            goto fail;
        }

        if (!(argv = _cargo_calloc(*argc, sizeof(char *))))
        {
            CARGODBG(1, "Out of memory!\n");
            goto fail;
        }

        // Convert from wchar_t * to ANSI char *
        for (i = 0; i < *argc; i++)
        {
            // Get the size needed for the target buffer.
            // CP_ACP = Ansi Codepage.
            needed = WideCharToMultiByte(CP_ACP, 0, wargs[i], -1,
                                        NULL, 0, NULL, NULL);

            if (!(argv[i] = _cargo_malloc(needed)))
            {
                CARGODBG(1, "Out of memory!\n");
                goto fail;
            }

            // Do the conversion.
            needed = WideCharToMultiByte(CP_ACP, 0, wargs[i], -1,
                                        argv[i], needed, NULL, NULL);
        }

        if (wargs) LocalFree(wargs);
        _cargo_xfree(&cmdlinew);
        return argv;

    fail:
        if (wargs) LocalFree(wargs);
        _cargo_xfree(&cmdlinew);
    }
    #endif // WIN32

    if (argv)
    {
        for (i = 0; i < *argc; i++)
        {
            _cargo_xfree(&argv[i]);
        }

        _cargo_free(argv);
    }

    return NULL;
}